

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall ON_Viewport::Read(ON_Viewport *this,ON_BinaryArchive *file)

{
  ON_3dPoint candidate_point;
  ON_3dVector candidate_vector;
  ON_3dVector candidate_vector_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  view_projection vVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  ON_Viewport *source_viewport;
  double dVar11;
  uint uStack_50;
  bool b;
  int minor_version;
  int i;
  int major_version;
  double scaleZ;
  double scaleY;
  double scaleX;
  
  source_viewport = &DefaultTopViewYUp;
  operator=(this,&DefaultTopViewYUp);
  this->m_bValidCamera = false;
  uVar7 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  this->m_bValidFrustum = false;
  this->m_bValidPort = false;
  this->m_bValidCameraFrame = false;
  *(undefined8 *)(this->m_projection_content_sha1).m_digest =
       ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
  *(undefined8 *)((this->m_projection_content_sha1).m_digest + 8) = uVar7;
  *(undefined4 *)((this->m_projection_content_sha1).m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  major_version = 0;
  minor_version = 1;
  bVar8 = ON_BinaryArchive::Read3dmChunkVersion(file,&major_version,&minor_version);
  if (!bVar8) {
    return bVar8;
  }
  if (major_version != 1) {
    return bVar8;
  }
  i = 0;
  bVar8 = ON_BinaryArchive::ReadInt(file,&i);
  if (bVar8) {
    this->m_bValidCamera = i != 0;
    this->m_bValidCameraFrame = i != 0;
    bVar8 = ON_BinaryArchive::ReadInt(file,&i);
    if (!bVar8) goto LAB_00660de9;
    this->m_bValidFrustum = i != 0;
    bVar8 = ON_BinaryArchive::ReadInt(file,&i);
    if (!bVar8) goto LAB_00660de9;
    this->m_bValidPort = i != 0;
    bVar8 = ON_BinaryArchive::ReadInt(file,&i);
    if (!bVar8) goto LAB_00660de9;
    vVar10 = ON::ViewProjection(i);
    this->m_projection = vVar10;
    bVar8 = ON_BinaryArchive::ReadPoint(file,&this->m_CamLoc);
    if (((((!bVar8) || (bVar8 = ON_BinaryArchive::ReadVector(file,&this->m_CamDir), !bVar8)) ||
         (bVar8 = ON_BinaryArchive::ReadVector(file,&this->m_CamUp), !bVar8)) ||
        ((((bVar8 = ON_BinaryArchive::ReadVector(file,&this->m_CamX), !bVar8 ||
           (bVar8 = ON_BinaryArchive::ReadVector(file,&this->m_CamY), !bVar8)) ||
          ((bVar8 = ON_BinaryArchive::ReadVector(file,&this->m_CamZ), !bVar8 ||
           ((bVar8 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_left), !bVar8 ||
            (bVar8 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_right), !bVar8)))))) ||
         (bVar8 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_bottom), !bVar8)))) ||
       (((((bVar8 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_top), !bVar8 ||
           (bVar8 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_near), !bVar8)) ||
          (bVar8 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_far), !bVar8)) ||
         ((bVar8 = ON_BinaryArchive::ReadInt(file,&this->m_port_left), !bVar8 ||
          (bVar8 = ON_BinaryArchive::ReadInt(file,&this->m_port_right), !bVar8)))) ||
        ((bVar8 = ON_BinaryArchive::ReadInt(file,&this->m_port_bottom), !bVar8 ||
         ((bVar8 = ON_BinaryArchive::ReadInt(file,&this->m_port_top), !bVar8 ||
          (bVar8 = ON_BinaryArchive::ReadInt(file,&this->m_port_near), !bVar8))))))))
    goto LAB_00660de9;
    bVar8 = ON_BinaryArchive::ReadInt(file,&this->m_port_far);
  }
  else {
LAB_00660de9:
    bVar8 = false;
  }
  if (this->m_bValidCamera == true) {
    dVar11 = (this->m_CamLoc).x;
    uVar1 = (this->m_CamLoc).y;
    uVar2 = (this->m_CamLoc).z;
    candidate_point.y = (double)uVar2;
    candidate_point.x = (double)uVar1;
    candidate_point.z._0_4_ = uStack_50;
    candidate_point.z._4_4_ = minor_version;
    bVar9 = IsValidCameraLocation(candidate_point);
    if (!bVar9) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_viewport.cpp"
                 ,0x13c,"","ON_Viewport.m_bValidCamera in file was true and it should be false.",
                 in_R8,in_R9,dVar11);
      this->m_bValidCamera = false;
    }
    dVar11 = (this->m_CamUp).x;
    uVar3 = (this->m_CamUp).y;
    uVar4 = (this->m_CamUp).z;
    candidate_vector.y = (double)uVar4;
    candidate_vector.x = (double)uVar3;
    candidate_vector.z._0_4_ = uStack_50;
    candidate_vector.z._4_4_ = minor_version;
    bVar9 = IsValidCameraUpOrDirection(candidate_vector);
    if (bVar9) {
      dVar11 = (this->m_CamDir).x;
      uVar5 = (this->m_CamDir).y;
      uVar6 = (this->m_CamDir).z;
      candidate_vector_00.y = (double)uVar6;
      candidate_vector_00.x = (double)uVar5;
      candidate_vector_00.z._0_4_ = uStack_50;
      candidate_vector_00.z._4_4_ = minor_version;
      bVar9 = IsValidCameraUpOrDirection(candidate_vector_00);
      if (!bVar9) goto LAB_00660e74;
      if ((this->m_bValidCamera & 1U) != 0) goto LAB_00660ebb;
    }
    else {
LAB_00660e74:
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_viewport.cpp"
                 ,0x141,"","ON_Viewport.m_bValidCamera in file was true and it should be false.",
                 in_R8,in_R9,dVar11);
      this->m_bValidCamera = false;
      this->m_bValidCameraFrame = false;
    }
    if (this->m_projection == perspective_view) {
      source_viewport = &DefaultPerspectiveViewZUp;
    }
    SetCamera(this,source_viewport,true);
  }
LAB_00660ebb:
  if ((((0 < minor_version & bVar8) != 1) ||
      (bVar8 = ON_BinaryArchive::ReadUuid(file,&this->m_viewport_id), !bVar8)) ||
     (minor_version < 2)) goto LAB_0066104f;
  uStack_50 = uStack_50 & 0xffffff;
  bVar8 = ON_BinaryArchive::ReadBool(file,&b);
  if (bVar8) {
    this->m_bLockCamUp = b;
    uStack_50 = uStack_50 & 0xffffff;
    bVar8 = ON_BinaryArchive::ReadBool(file,&b);
    if (!bVar8) goto LAB_00661048;
    this->m_bLockCamDir = b;
    uStack_50 = uStack_50 & 0xffffff;
    bVar8 = ON_BinaryArchive::ReadBool(file,&b);
    if (!bVar8) goto LAB_00661048;
    this->m_bLockCamLoc = b;
    uStack_50 = uStack_50 & 0xffffff;
    bVar8 = ON_BinaryArchive::ReadBool(file,&b);
    if (bVar8) {
      this->m_frustum_symmetry_flags = b * '\x02' | this->m_frustum_symmetry_flags & 0xfd;
      uStack_50 = uStack_50 & 0xffffff;
      bVar8 = ON_BinaryArchive::ReadBool(file,&b);
      if (bVar8) {
        this->m_frustum_symmetry_flags = this->m_frustum_symmetry_flags & 0xfe | b;
        bVar8 = true;
        if (((minor_version < 3) ||
            (bVar8 = ON_BinaryArchive::ReadPoint(file,&this->m_target_point), !bVar8)) ||
           ((minor_version < 4 ||
            ((bVar8 = ON_BinaryArchive::ReadBool(file,&this->m_bValidCameraFrame), !bVar8 ||
             (minor_version < 5)))))) goto LAB_0066104f;
        scaleX = 1.0;
        scaleY = 1.0;
        scaleZ = 1.0;
        bVar8 = ON_BinaryArchive::ReadDouble(file,&scaleX);
        if ((bVar8) &&
           ((bVar8 = ON_BinaryArchive::ReadDouble(file,&scaleY), bVar8 &&
            (bVar8 = ON_BinaryArchive::ReadDouble(file,&scaleZ), bVar8)))) {
          SetViewScale(this,scaleX,scaleY,scaleZ);
          bVar8 = true;
          goto LAB_0066104f;
        }
      }
    }
  }
  else {
LAB_00661048:
    uStack_50 = uStack_50 & 0xffffff;
  }
  bVar8 = false;
LAB_0066104f:
  if (this->m_bValidFrustum == true) {
    bVar9 = ON_IsValid(this->m_frus_left);
    if ((((bVar9) && (bVar9 = ON_IsValid(this->m_frus_right), bVar9)) &&
        (bVar9 = ON_IsValid(this->m_frus_top), bVar9)) &&
       (((bVar9 = ON_IsValid(this->m_frus_bottom), bVar9 &&
         (bVar9 = ON_IsValid(this->m_frus_near), bVar9)) &&
        (bVar9 = ON_IsValid(this->m_frus_far), bVar9)))) {
      if (this->m_frus_left < this->m_frus_right) {
        if (((this->m_frus_bottom < this->m_frus_top) && (0.0 < this->m_frus_near)) &&
           ((this->m_frus_far < 1e+100 &&
            ((((this->m_frus_top < 1e+100 && (-1e+100 < this->m_frus_bottom)) &&
              (this->m_frus_right < 1e+100)) &&
             ((-1e+100 < this->m_frus_left && (this->m_frus_near < this->m_frus_far)))))))) {
          return bVar8;
        }
      }
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_viewport.cpp"
               ,0x194,"","ON_Viewport.m_bValidFrustum in file was true and it should be false.");
    this->m_bValidFrustum = false;
  }
  return bVar8;
}

Assistant:

bool ON_Viewport::Read( ON_BinaryArchive& file )
{
  *this = ON_Viewport::DefaultTopViewYUp;

  m_bValidCamera = false;
  m_bValidFrustum = false;
  m_bValidPort = false;
  m_bValidCameraFrame = false;

  m_projection_content_sha1 = ON_SHA1_Hash::ZeroDigest;

  int major_version = 0;
  int minor_version = 1;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) 
  {
    // common to all 1.x versions
    int i=0;
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_bValidCamera = (i?true:false);
    if (rc)
      m_bValidCameraFrame = m_bValidCamera;
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_bValidFrustum = (i?true:false);
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_bValidPort = (i?true:false);
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_projection = ON::ViewProjection(i);
    if (rc) rc = file.ReadPoint( m_CamLoc );
    if (rc) rc = file.ReadVector( m_CamDir );
    if (rc) rc = file.ReadVector( m_CamUp );
    if (rc) rc = file.ReadVector( m_CamX );
    if (rc) rc = file.ReadVector( m_CamY );
    if (rc) rc = file.ReadVector( m_CamZ );
    if (rc) rc = file.ReadDouble( &m_frus_left );
    if (rc) rc = file.ReadDouble( &m_frus_right );
    if (rc) rc = file.ReadDouble( &m_frus_bottom );
    if (rc) rc = file.ReadDouble( &m_frus_top );
    if (rc) rc = file.ReadDouble( &m_frus_near );
    if (rc) rc = file.ReadDouble( &m_frus_far );
    if (rc) rc = file.ReadInt( &m_port_left );
    if (rc) rc = file.ReadInt( &m_port_right );
    if (rc) rc = file.ReadInt( &m_port_bottom );
    if (rc) rc = file.ReadInt( &m_port_top );
    if (rc) rc = file.ReadInt( &m_port_near );
    if (rc) rc = file.ReadInt( &m_port_far );   

    if ( m_bValidCamera )
    {
      if ( !ON_Viewport::IsValidCameraLocation(m_CamLoc) )
      {
        ON_ERROR("ON_Viewport.m_bValidCamera in file was true and it should be false.");
        m_bValidCamera = false;
      }
      if ( !ON_Viewport::IsValidCameraUpOrDirection(m_CamUp) || !ON_Viewport::IsValidCameraUpOrDirection(m_CamDir) )
      {
        ON_ERROR("ON_Viewport.m_bValidCamera in file was true and it should be false.");
        m_bValidCamera = false;
        m_bValidCameraFrame = false;
      }
      if (!m_bValidCamera)
      {
        if (ON::view_projection::perspective_view == m_projection)
          SetCamera(ON_Viewport::DefaultPerspectiveViewZUp, true);
        else
          SetCamera(ON_Viewport::DefaultTopViewYUp, true);
      }
    }

    if (rc && minor_version >= 1 )
    {
      // 1.1 fields
      if (rc) rc = file.ReadUuid(m_viewport_id);

      if (rc && minor_version >= 2 )
      {
        // 1.2 fields 
        bool b;
        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetCameraUpLock(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetCameraDirectionLock(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetCameraLocationLock(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetFrustumLeftRightSymmetry(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetFrustumTopBottomSymmetry(b);

        if (rc && minor_version >= 3 )
        {
          // added 18, June 2013 to V6
          rc = file.ReadPoint(m_target_point);

          if (rc && minor_version >= 4)
          {
            rc = file.ReadBool(&m_bValidCameraFrame);

            if (rc && minor_version >= 5)
            {
              double scaleX = 1, scaleY = 1, scaleZ = 1;
              rc = file.ReadDouble(&scaleX);
              if (rc) rc = file.ReadDouble(&scaleY);
              if (rc) rc = file.ReadDouble(&scaleZ);
              if (rc)
              {
                SetViewScale(scaleX, scaleY, scaleZ);
              }
            }
          }
        }
      }
    }

    if( m_bValidFrustum )
    {
      if (    !ON_IsValid(m_frus_left) || !ON_IsValid(m_frus_right)
           || !ON_IsValid(m_frus_top)  || !ON_IsValid(m_frus_bottom)
           || !ON_IsValid(m_frus_near) || !ON_IsValid(m_frus_far)
           || !(m_frus_left < m_frus_right)
           || !(m_frus_bottom < m_frus_top)
           || !(0.0 < m_frus_near)
           || !(m_frus_near < m_frus_far)
           || !(-ON_NONSENSE_WORLD_COORDINATE_VALUE < m_frus_left)
           || !(m_frus_right < ON_NONSENSE_WORLD_COORDINATE_VALUE)
           || !(-ON_NONSENSE_WORLD_COORDINATE_VALUE < m_frus_bottom)
           || !(m_frus_top < ON_NONSENSE_WORLD_COORDINATE_VALUE)
           || !(m_frus_far < ON_NONSENSE_WORLD_COORDINATE_VALUE)
         )
      {
        ON_ERROR("ON_Viewport.m_bValidFrustum in file was true and it should be false.");
        m_bValidFrustum = false;
      }
    }
  }
  return rc;
}